

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_hdr_add_hrec(bcf_hdr_t *hdr,bcf_hrec_t *hrec)

{
  int iVar1;
  int iVar2;
  bcf_hrec_t **ppbVar3;
  int local_24;
  int n;
  int i;
  bcf_hrec_t *hrec_local;
  bcf_hdr_t *hdr_local;
  
  if (hrec == (bcf_hrec_t *)0x0) {
    return 0;
  }
  hrec->type = 5;
  iVar1 = bcf_hdr_register_hrec(hdr,hrec);
  if (iVar1 == 0) {
    if (hrec->type != 5) {
      bcf_hrec_destroy(hrec);
      return 0;
    }
    local_24 = 0;
    while ((local_24 < hdr->nhrec &&
           ((hdr->hrec[local_24]->type != 5 ||
            (((iVar1 = strcmp(hdr->hrec[local_24]->key,hrec->key), iVar1 != 0 ||
              (iVar1 = strcmp(hrec->key,"fileformat"), iVar1 != 0)) &&
             ((iVar1 = strcmp(hdr->hrec[local_24]->key,hrec->key), iVar1 != 0 ||
              (iVar1 = strcmp(hdr->hrec[local_24]->value,hrec->value), iVar1 != 0))))))))) {
      local_24 = local_24 + 1;
    }
    if (local_24 < hdr->nhrec) {
      bcf_hrec_destroy(hrec);
      return 0;
    }
  }
  iVar1 = hdr->nhrec;
  iVar2 = iVar1 + 1;
  hdr->nhrec = iVar2;
  ppbVar3 = (bcf_hrec_t **)realloc(hdr->hrec,(long)iVar2 << 3);
  hdr->hrec = ppbVar3;
  hdr->hrec[iVar1] = hrec;
  hdr->dirty = 1;
  return (uint)(hrec->type != 5);
}

Assistant:

int bcf_hdr_add_hrec(bcf_hdr_t *hdr, bcf_hrec_t *hrec)
{
    if ( !hrec ) return 0;

    hrec->type = BCF_HL_GEN;
    if ( !bcf_hdr_register_hrec(hdr,hrec) )
    {
        // If one of the hashed field, then it is already present
        if ( hrec->type != BCF_HL_GEN )
        {
            bcf_hrec_destroy(hrec);
            return 0;
        }

        // Is one of the generic fields and already present?
        int i;
        for (i=0; i<hdr->nhrec; i++)
        {
            if ( hdr->hrec[i]->type!=BCF_HL_GEN ) continue;
            if ( !strcmp(hdr->hrec[i]->key,hrec->key) && !strcmp(hrec->key,"fileformat") ) break;
            if ( !strcmp(hdr->hrec[i]->key,hrec->key) && !strcmp(hdr->hrec[i]->value,hrec->value) ) break;
        }
        if ( i<hdr->nhrec )
        {
            bcf_hrec_destroy(hrec);
            return 0;
        }
    }

    // New record, needs to be added
    int n = ++hdr->nhrec;
    hdr->hrec = (bcf_hrec_t**) realloc(hdr->hrec, n*sizeof(bcf_hrec_t*));
    hdr->hrec[n-1] = hrec;
    hdr->dirty = 1;

    return hrec->type==BCF_HL_GEN ? 0 : 1;
}